

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proxy_functions.hpp
# Opt level: O3

void __thiscall
chaiscript::dispatch::
Proxy_Function_Callable_Impl<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int),_void_(*)(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int)>
::Proxy_Function_Callable_Impl
          (Proxy_Function_Callable_Impl<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int),_void_(*)(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int)>
           *this,_func_void_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_ptr_int
                 *f)

{
  long lVar1;
  undefined **ppuVar2;
  Type_Info *pTVar3;
  initializer_list<chaiscript::Type_Info> __l;
  allocator_type local_79;
  vector<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_> local_78;
  Type_Info local_60 [3];
  
  ppuVar2 = &PTR_typeinfo_0031f738;
  pTVar3 = local_60;
  for (lVar1 = 9; lVar1 != 0; lVar1 = lVar1 + -1) {
    pTVar3->m_type_info = (type_info *)*ppuVar2;
    ppuVar2 = ppuVar2 + 1;
    pTVar3 = (Type_Info *)&pTVar3->m_bare_type_info;
  }
  __l._M_len = 3;
  __l._M_array = local_60;
  std::vector<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>::vector
            (&local_78,__l,&local_79);
  Proxy_Function_Impl_Base::Proxy_Function_Impl_Base
            (&this->super_Proxy_Function_Impl_Base,&local_78);
  if (local_78.super__Vector_base<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_78.
                    super__Vector_base<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_78.
                          super__Vector_base<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_78.
                          super__Vector_base<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  (this->super_Proxy_Function_Impl_Base).super_Proxy_Function_Base._vptr_Proxy_Function_Base =
       (_func_int **)&PTR__Proxy_Function_Base_00328aa8;
  this->m_f = f;
  return;
}

Assistant:

explicit Proxy_Function_Callable_Impl(Callable f)
          : Proxy_Function_Impl_Base(detail::build_param_type_list(static_cast<Func *>(nullptr)))
          , m_f(std::move(f)) {
      }